

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisNodeHandlerModrmMod
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanStatus ZVar1;
  undefined8 in_RAX;
  ZyanU8 modrm_byte;
  ZyanU8 local_11;
  
  local_11 = (ZyanU8)((ulong)in_RAX >> 0x38);
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf0e,
                  "ZyanStatus ZydisNodeHandlerModrmMod(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if ((instruction->raw).modrm.offset == '\0') {
    (instruction->raw).modrm.offset = instruction->length;
    ZVar1 = ZydisInputNext(state,instruction,&local_11);
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    ZydisDecodeModRM(instruction,local_11);
  }
  *index = (ushort)(instruction->raw).modrm.mod;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisNodeHandlerModrmMod(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    if (!instruction->raw.modrm.offset)
    {
        instruction->raw.modrm.offset = instruction->length;
        ZyanU8 modrm_byte;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &modrm_byte));
        ZydisDecodeModRM(instruction, modrm_byte);
    }
    *index = instruction->raw.modrm.mod;
    return ZYAN_STATUS_SUCCESS;
}